

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O1

_DecodeResult
decode_internal(_CodeInfo *_ci,int supportOldIntr,_DInst *result,uint maxResultCount,
               uint *usedInstructionsCount)

{
  byte *pbVar1;
  ushort uVar2;
  long lVar3;
  _OffsetType _Var4;
  uint8_t *puVar5;
  int iVar6;
  uint16_t uVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  _InstInfo *ii;
  short *psVar11;
  char cVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  uint instFlags;
  _DInst *di;
  _InstSharedInfo *p_Var16;
  uint modrm;
  _DecodeType _Var17;
  _DecodeType _Var18;
  bool bVar19;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int local_120;
  _DecodeResult local_11c;
  _CodeInfo local_118;
  ulong local_e8;
  uint local_dc;
  _PrefixState ps;
  short sVar20;
  short sVar23;
  
  local_118.codeOffset = _ci->codeOffset;
  local_118.nextOffset = _ci->nextOffset;
  local_118.code = _ci->code;
  local_118.codeLen = _ci->codeLen;
  local_118.dt = _ci->dt;
  local_118._40_8_ = *(undefined8 *)&_ci->features;
  lVar3 = (ulong)maxResultCount << 6;
  if (supportOldIntr != 0) {
    lVar3 = (ulong)maxResultCount * 0xa8;
  }
  local_e8 = 0xa8;
  if (supportOldIntr == 0) {
    local_e8 = 0x40;
  }
  local_118.addrMask = 0xffffffffffffffff;
  ps.count = 1;
  auVar25._0_4_ = -(uint)((local_118._40_8_ & 0x7f8) == 0);
  auVar25._4_4_ = -(uint)((local_118._40_8_ & 0x800) == 0);
  auVar25._8_4_ = -(uint)((local_118._40_8_ & 0x1000) == 0);
  auVar25._12_4_ = -(uint)((local_118._40_8_ & 4) == 0);
  uVar9 = movmskps((int)&ps,auVar25);
  auVar24._0_4_ = -(uint)((local_118._40_8_ & 8) != 0);
  auVar24._4_4_ = -(uint)((local_118._40_8_ & 0x10) != 0);
  auVar24._8_4_ = -(uint)((local_118._40_8_ & 0x20) != 0);
  auVar24._12_4_ = -(uint)((local_118._40_8_ & 0x40) != 0);
  auVar21._0_4_ = -(uint)((local_118._40_8_ & 0x80) != 0);
  auVar21._4_4_ = -(uint)((local_118._40_8_ & 0x100) != 0);
  auVar21._8_4_ = -(uint)((local_118._40_8_ & 0x200) != 0);
  auVar21._12_4_ = -(uint)((local_118._40_8_ & 0x400) != 0);
  auVar25 = packssdw(auVar24,auVar21);
  local_dc = local_118.features;
  di = result;
LAB_00103a01:
  do {
    do {
      puVar5 = local_118.code;
      _Var4 = local_118.codeOffset;
      iVar6 = local_118.codeLen;
      if (local_118.codeLen < 1) {
        local_11c = DECRES_SUCCESS;
        goto LAB_001042a0;
      }
      if (ps.count != 0) {
        ps.vexV = 0;
        ps.vrex = 0;
        ps.vexPos = (uint8_t *)0x0;
        ps.pfxIndexer[1] = 0;
        ps.pfxIndexer[2] = 0;
        ps.pfxIndexer[3] = 0;
        ps.pfxIndexer[4] = 0;
        ps.prefixExtType = PET_NONE;
        ps.isOpSizeMandatory = 0;
        ps.decodedPrefixes = 0;
        ps.usedPrefixes = 0;
        ps.count = 0;
        ps.unusedPrefixesMask = 0;
        ps.pfxIndexer[0] = 0;
      }
      if ((_DInst *)((long)result->ops + lVar3 + -0x22) <= di) {
        local_11c = DECRES_MEMORYERR;
        goto LAB_001042a0;
      }
      local_11c = DECRES_SUCCESS;
      local_120 = 0;
      ii = inst_lookup(&local_118,&ps,&local_120);
      auVar21 = (undefined1  [16])ps._0_16_;
      if (ii == (_InstInfo *)0x0) {
LAB_00104007:
        if (*puVar5 != 0x9b) {
          local_118.codeOffset = local_118.codeOffset + di->size;
          if ((byte)((byte)uVar9 >> 3) != 0) {
            di->addr = 0;
            di->flags = 0;
            di->unusedPrefixesMask = 0;
            di->usedRegistersMask = 0;
            *(undefined1 (*) [16])&di->ops[3].size = (undefined1  [16])0x0;
            di->opcode = 0;
            di->ops[0].type = '\0';
            di->ops[0].index = '\0';
            di->ops[0].size = 0;
            di->ops[1].type = '\0';
            di->ops[1].index = '\0';
            di->ops[1].size = 0;
            di->ops[2].type = '\0';
            di->ops[2].index = '\0';
            di->ops[2].size = 0;
            di->ops[3].type = '\0';
            di->ops[3].index = '\0';
            di->imm = (_Value)0x0;
            di->disp = 0;
            di->flags = 0xffff;
            (di->imm).byte = *puVar5;
            di->size = '\x01';
            di->addr = local_118.addrMask & _Var4;
            di = (_DInst *)((long)di->ops + (local_e8 - 0x22));
            if ((uVar9 & 4) == 0) goto LAB_001042a0;
          }
          local_118.code = puVar5 + 1;
          local_118.codeLen = iVar6 + -1;
          local_118.codeOffset = _Var4 + 1;
          goto LAB_00103a01;
        }
        *(undefined1 (*) [16])&di->ops[3].size = (undefined1  [16])0x0;
        di->opcode = 0;
        di->ops[0].type = '\0';
        di->ops[0].index = '\0';
        di->ops[0].size = 0;
        di->ops[1].type = '\0';
        di->ops[1].index = '\0';
        di->ops[1].size = 0;
        di->ops[2].type = '\0';
        di->ops[2].index = '\0';
        di->ops[2].size = 0;
        di->ops[3].type = '\0';
        di->ops[3].index = '\0';
        di->addr = 0;
        di->flags = 0;
        di->unusedPrefixesMask = 0;
        di->usedRegistersMask = 0;
        di->imm = (_Value)0x0;
        di->disp = 0;
        di->addr = local_118.addrMask & local_118.codeOffset;
        (di->imm).sbyte = -0x65;
        di->base = 0xff;
        di->size = '\x01';
        di->segment = 0xff;
        di->opcode = 0x273a;
        pbVar1 = (byte *)((long)&di->meta + 1);
        *pbVar1 = *pbVar1 | 1;
        local_118.codeLen = ((int)local_118.code - (int)puVar5) + local_118.codeLen + -1;
        local_118.code = puVar5 + 1;
      }
      else {
        uVar8 = ii->sharedIndex;
        instFlags = FlagsTable[InstSharedInfoTable[uVar8].flagsIndex];
        _Var18 = local_118.dt;
        _Var17 = local_118.dt;
        if (local_120 == 0) {
          if (local_118.dt == Decode64Bits) {
            _Var18 = ((instFlags & 0x3000000) == 0x1000000) + Decode32Bits;
          }
        }
        else {
          if (((((ps.decodedPrefixes >> 0xd & 1) != 0) && (ps.prefixExtType == PET_REX)) &&
              (((undefined1  [16])ps._32_16_ & (undefined1  [16])0x800000000) !=
               (undefined1  [16])0x0)) && (ps.isOpSizeMandatory == 0)) {
            ps.decodedPrefixes = ps.decodedPrefixes & 0xffffdfff;
            auVar24 = (undefined1  [16])ps._0_16_;
            ps.unusedPrefixesMask = auVar21._12_2_;
            ps.pfxIndexer[0] = auVar21._14_2_;
            ps._0_12_ = auVar24._0_12_;
            ps.unusedPrefixesMask = ps.unusedPrefixesMask | ps.pfxIndexer[3];
          }
          _Var17 = (uint)(local_118.dt != Decode32Bits);
          if ((ps.decodedPrefixes >> 0xe & 1) == 0) {
            _Var17 = local_118.dt;
          }
          if ((ps.decodedPrefixes >> 0xd & 1) == 0) {
            if ((local_118.dt == Decode64Bits) &&
               (_Var18 = Decode64Bits, (instFlags & 0x3000000) != 0x1000000)) {
              _Var18 = Decode64Bits -
                       (((undefined1  [16])ps._32_16_ & (undefined1  [16])0x800000000) ==
                        (undefined1  [16])0x0 || (ps.decodedPrefixes >> 0x19 & 1) == 0);
            }
          }
          else {
            _Var18 = (uint)(local_118.dt == Decode16Bits);
          }
        }
        *(undefined1 (*) [16])&di->ops[3].size = (undefined1  [16])0x0;
        di->opcode = 0;
        di->ops[0].type = '\0';
        di->ops[0].index = '\0';
        di->ops[0].size = 0;
        di->ops[1].type = '\0';
        di->ops[1].index = '\0';
        di->ops[1].size = 0;
        di->ops[2].type = '\0';
        di->ops[2].index = '\0';
        di->ops[2].size = 0;
        di->ops[3].type = '\0';
        di->ops[3].index = '\0';
        di->addr = 0;
        di->flags = 0;
        di->unusedPrefixesMask = 0;
        di->usedRegistersMask = 0;
        di->imm = (_Value)0x0;
        di->disp = 0;
        modrm = 0;
        if ((instFlags & 1) != 0) {
          if ((instFlags >> 0x1e & 1) == 0) {
            local_118.code = local_118.code + 1;
            iVar10 = local_118.codeLen;
            local_118.codeLen = local_118.codeLen + -1;
            if (iVar10 < 1) goto LAB_00104007;
          }
          modrm = (uint)*local_118.code;
        }
        p_Var16 = InstSharedInfoTable + uVar8;
        local_118.code = local_118.code + 1;
        di->addr = local_118.addrMask & local_118.codeOffset;
        di->opcode = ii->opcodeId;
        uVar2 = InstSharedInfoTable[uVar8].meta;
        di->segment = 0xff;
        di->base = 0xff;
        di->flags = (ushort)((_Var17 & (Decode64Bits|Decode32Bits)) << 10) | uVar2 & 0x8000;
        if (InstSharedInfoTable[uVar8].d != 0) {
          if ((((instFlags & 0x10100000) != 0) &&
              (((modrm < 0xc0 && ((instFlags & 0x100000) != 0)) ||
               (((instFlags >> 0x1c & 1) != 0 && ((modrm & 0x38) != 0)))))) ||
             (iVar10 = operands_extract(&local_118,di,ii,instFlags,
                                        (uint)InstSharedInfoTable[uVar8].d,modrm,&ps,_Var18,_Var17,
                                        di->ops), iVar10 == 0)) goto LAB_00104007;
          if (InstSharedInfoTable[uVar8].s == 0) {
            cVar12 = '\x01';
          }
          else {
            iVar10 = operands_extract(&local_118,di,ii,instFlags,(uint)InstSharedInfoTable[uVar8].s,
                                      modrm,&ps,_Var18,_Var17,di->ops + 1);
            if (iVar10 == 0) goto LAB_00104007;
            cVar12 = '\x02';
            if ((instFlags >> 0x11 & 1) != 0) {
              iVar10 = operands_extract(&local_118,di,ii,instFlags,
                                        (uint)*(byte *)((long)&ii[1].sharedIndex + 1),modrm,&ps,
                                        _Var18,_Var17,di->ops + 2);
              if (iVar10 == 0) goto LAB_00104007;
              cVar12 = '\x03';
              if ((instFlags >> 0x12 & 1) != 0) {
                iVar10 = operands_extract(&local_118,di,ii,instFlags,(uint)(byte)ii[1].opcodeId,
                                          modrm,&ps,_Var18,_Var17,di->ops + 3);
                cVar12 = '\x04';
                if (iVar10 == 0) goto LAB_00104007;
              }
            }
          }
          di->flags = di->flags | (ushort)(instFlags >> 0x19) & 0xffc0;
          di->opsNo = di->opsNo + cVar12;
        }
        if ((instFlags & 0x8e0c060) != 0) {
          if ((short)instFlags < 0) {
            ps.usedPrefixes = ps.usedPrefixes | ps.decodedPrefixes & 0x2000;
          }
          if (local_118.dt == Decode64Bits) {
            uVar14 = instFlags >> 0x17;
          }
          else {
            uVar14 = instFlags >> 0x1b;
          }
          if ((uVar14 & 1) == 0) {
            if ((instFlags >> 0x15 & 1) != 0) {
              ii = inst_lookup_3dnow(&local_118);
              if (ii == (_InstInfo *)0x0) goto LAB_00104007;
              p_Var16 = InstSharedInfoTable + ii->sharedIndex;
              instFlags = FlagsTable[p_Var16->flagsIndex];
              di->opcode = ii->opcodeId;
            }
            if ((instFlags >> 0x16 & 1) == 0) {
              if (((instFlags & 0x60) != 0) && (local_120 != 0)) {
                if (((instFlags & 0x20) == 0) ||
                   (((undefined1  [16])ps._0_16_ & (undefined1  [16])0x20) == (undefined1  [16])0x0)
                   ) {
                  if (((instFlags & 0x40) == 0) ||
                     (((undefined1  [16])ps._0_16_ & (undefined1  [16])0x40) ==
                      (undefined1  [16])0x0)) goto LAB_00103eef;
                  uVar8 = 4;
                  uVar14 = 0x40;
                }
                else {
                  uVar8 = 2;
                  uVar14 = 0x20;
                }
                ps.usedPrefixes = ps.usedPrefixes | uVar14;
                di->flags = di->flags | uVar8;
              }
LAB_00103eef:
              if ((instFlags >> 0xe & 1) == 0) goto LAB_00103ef9;
              if ((instFlags >> 0x10 & 1) != 0) {
                ps._0_6_ = ps._0_6_ | 0x400000000000;
                if (_Var17 == Decode32Bits) goto LAB_00103fae;
                if (_Var17 != Decode16Bits) goto LAB_00103fb5;
                uVar7 = ii->opcodeId;
                goto LAB_00103fba;
              }
              if ((short)instFlags < 0) {
                di->opcode = ii->opcodeId;
                ps._0_6_ = ps._0_6_ | 0x400000000000;
              }
              goto LAB_00103fbe;
            }
            iVar10 = local_118.codeLen;
            local_118.codeLen = local_118.codeLen + -1;
            if (0 < iVar10) {
              bVar13 = *local_118.code;
              local_118.code = local_118.code + 1;
              if ((instFlags >> 0x1d & 1) == 0) {
                if (bVar13 < 8) {
                  psVar11 = (short *)((long)CmpMnemonicOffsets + (ulong)((uint)bVar13 * 2));
LAB_00103ed1:
                  uVar7 = *psVar11 + ii->opcodeId;
                  goto LAB_00103fba;
                }
              }
              else if (bVar13 < 0x20) {
                psVar11 = (short *)((long)VCmpMnemonicOffsets + (ulong)((uint)bVar13 * 2));
                goto LAB_00103ed1;
              }
            }
          }
          goto LAB_00104007;
        }
LAB_00103ef9:
        if (_Var18 == Decode64Bits) {
          pbVar1 = (byte *)((long)&di->flags + 1);
          *pbVar1 = *pbVar1 | 2;
          if ((instFlags & 0x4010000) == 0) goto LAB_00103fbe;
          if ((0xbf < modrm) && ((instFlags & 0x80000) != 0)) goto LAB_00104007;
          if (((instFlags >> 0x1a & 1) == 0) ||
             (((undefined1  [16])ps._32_16_ & (undefined1  [16])0x800000000) ==
              (undefined1  [16])0x0)) {
LAB_00103fae:
            uVar7 = ii[2].sharedIndex;
          }
          else {
            ps._0_8_ = ps._0_8_ | 0x200000000000000;
LAB_00103fb5:
            uVar7 = ii[2].opcodeId;
          }
LAB_00103fba:
          di->opcode = uVar7;
        }
        else if (_Var18 == Decode32Bits) {
          pbVar1 = (byte *)((long)&di->flags + 1);
          *pbVar1 = *pbVar1 | 1;
          if ((instFlags >> 0x10 & 1) != 0) {
            if (((instFlags >> 0x13 & 1) == 0) || (modrm < 0xc0)) {
              di->opcode = ii[2].sharedIndex;
            }
LAB_00103f75:
            ps._0_6_ = ps._0_6_ | 0x200000000000;
          }
        }
        else if ((instFlags & 0x1010008) == 0x10000) goto LAB_00103f75;
LAB_00103fbe:
        if (((local_120 != 0) && ((instFlags & 0x20000000) != 0)) &&
           ((((ii[1].sharedIndex & 4) != 0 &&
             (((undefined1  [16])ps._32_16_ & (undefined1  [16])0x800000000) !=
              (undefined1  [16])0x0)) ||
            (((ii[1].sharedIndex & 8) != 0 &&
             (((undefined1  [16])ps._32_16_ & (undefined1  [16])0x1000000000) !=
              (undefined1  [16])0x0)))))) {
          di->opcode = ii[2].sharedIndex;
        }
        bVar13 = (char)local_118.code - (char)puVar5;
        di->size = bVar13;
        if ((bVar13 & 0xf0) != 0) goto LAB_00104007;
        if (local_120 != 0) {
          uVar7 = prefixes_set_unused_mask(&ps);
          di->unusedPrefixesMask = uVar7;
        }
        di->meta = p_Var16->meta;
        if ((local_118._40_8_ & 0x4000) != 0) {
          bVar13 = p_Var16->testedFlagsMask;
          if (bVar13 != 0) {
            di->testedFlagsMask =
                 (ushort)((bVar13 & 0x20) << 6) |
                 (ushort)((bVar13 & 8) << 7) | CONCAT11(bVar13,bVar13) & 0x2d5;
          }
          bVar13 = p_Var16->modifiedFlagsMask;
          if (bVar13 != 0) {
            di->modifiedFlagsMask =
                 (ushort)((bVar13 & 0x20) << 6) |
                 (ushort)((bVar13 & 8) << 7) | CONCAT11(bVar13,bVar13) & 0x2d5;
          }
          bVar13 = p_Var16->undefinedFlagsMask;
          if (bVar13 != 0) {
            di->undefinedFlagsMask =
                 (ushort)((bVar13 & 0x20) << 6) |
                 (ushort)((bVar13 & 8) << 7) | CONCAT11(bVar13,bVar13) & 0x2d5;
          }
        }
      }
      local_118.codeOffset = local_118.codeOffset + di->size;
      if ((local_dc & 0x2ffc) == 0) goto LAB_00104284;
      if ((local_dc >> 0xd & 1) != 0) {
        local_118.code = puVar5 + 1;
        local_118.codeLen = iVar6 + -1;
        local_118.codeOffset = _Var4 + 1;
      }
    } while (((local_dc & 4) != 0) && ((di->meta & 0xf) == 0));
    if (((uVar9 & 2) == 0) && ((short)di->flags < 0)) {
      di = (_DInst *)((long)di->ops + (local_e8 - 0x22));
LAB_001042a0:
      *usedInstructionsCount = (uint)((ulong)((long)di - (long)result) / local_e8);
      _ci->nextOffset = local_118.codeOffset;
      return local_11c;
    }
    if ((uVar9 & 1) == 0) {
      uVar8 = di->meta & 0xf;
      if (uVar8 == 0) {
        bVar19 = true;
      }
      else {
        auVar21 = pshuflw(ZEXT216(uVar8),ZEXT216(uVar8),0);
        sVar20 = auVar21._0_2_;
        auVar22._0_2_ = -(ushort)(sVar20 == 1);
        sVar23 = auVar21._2_2_;
        auVar22._2_2_ = -(ushort)(sVar23 == 2);
        auVar22._4_2_ = -(ushort)(sVar20 == 3);
        auVar22._6_2_ = -(ushort)(sVar23 == 4);
        auVar22._8_2_ = -(ushort)(sVar20 == 5);
        auVar22._10_2_ = -(ushort)(sVar23 == 6);
        auVar22._12_2_ = -(ushort)(sVar20 == 7);
        auVar22._14_2_ = -(ushort)(sVar23 == 8);
        auVar21 = psllw(auVar22 & auVar25,0xf);
        bVar19 = (((((((((((((((auVar21 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                              (auVar21 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar21 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar21 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar21 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar21 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar21 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar21 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar21 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar21 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar21 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar21 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar21 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar21 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar21 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 -1 < auVar21[0xf];
        uVar15 = local_e8;
        if ((((((((auVar21 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar21 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar21 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar21 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar21 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar21 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar21 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar21[0xf]
           ) {
          uVar15 = 0;
        }
        di = (_DInst *)((long)di->ops + (uVar15 - 0x22));
      }
      if (!bVar19) goto LAB_001042a0;
    }
LAB_00104284:
    di = (_DInst *)((long)di->ops + (local_e8 - 0x22));
  } while( true );
}

Assistant:

_DecodeResult decode_internal(_CodeInfo* _ci, int supportOldIntr, _DInst result[], unsigned int maxResultCount, unsigned int* usedInstructionsCount)
{
	_CodeInfo ci = *_ci; /* A working copy, we don't touch user's _ci except OUT params. */
	_PrefixState ps;
	/* Bookkeep these from ci below, as it makes things way simpler. */
	const uint8_t* code;
	int codeLen;
	_OffsetType codeOffset;

	_DecodeResult ret = DECRES_SUCCESS;

	/* Current working decoded instruction in results. */
	_DInst* pdi = (_DInst*)&result[0]; /* There's always a room for at least one slot, checked earlier. */
	_DInst* maxResultAddr;

	unsigned int features = ci.features;

	unsigned int diStructSize;
	/* Use next entry. */
#ifndef DISTORM_LIGHT
	if (supportOldIntr) {
		diStructSize = sizeof(_DecodedInst);
		maxResultAddr = (_DInst*)((size_t)&result[0] + (maxResultCount * sizeof(_DecodedInst)));
	}
	else
#endif /* DISTORM_LIGHT */
	{
		diStructSize = sizeof(_DInst);
		maxResultAddr = &result[maxResultCount];
	}

	ci.addrMask = (_OffsetType)-1;

#ifdef DISTORM_LIGHT
	supportOldIntr; /* Unreferenced. */

	/*
	 * Only truncate address if we are using the decompose interface.
	 * Otherwise, we use the textual interface which needs full addresses for formatting bytes output.
	 * So distorm_format will truncate later.
	 */
	if (features & DF_MAXIMUM_ADDR32) ci.addrMask = 0xffffffff;
	else if (features & DF_MAXIMUM_ADDR16) ci.addrMask = 0xffff;
#endif

	ps.count = 1; /* Force zero'ing ps below. */

	/* Decode instructions as long as we have what to decode/enough room in entries. */
	while (ci.codeLen > 0) {
		code = ci.code;
		codeLen = ci.codeLen;
		codeOffset = ci.codeOffset;

		if (ps.count) memset(&ps, 0, sizeof(ps));

		/**** INSTRUCTION DECODING NEXT: ****/

		/* Make sure we didn't run out of output entries. */
		if (pdi >= maxResultAddr) {
			ret = DECRES_MEMORYERR;
			break;
		}

		ret = decode_inst(&ci, &ps, code, pdi);
		/* decode_inst keeps track (only if successful!) for code and codeLen but ignores codeOffset, fix it here. */
		ci.codeOffset += pdi->size;

		if (ret == DECRES_SUCCESS) {

			if (features & (DF_SINGLE_BYTE_STEP | DF_RETURN_FC_ONLY | DF_STOP_ON_PRIVILEGED | DF_STOP_ON_FLOW_CONTROL)) {

				/* Sync codeinfo, remember that currently it points to beginning of the instruction and prefixes if any. */
				if (features & DF_SINGLE_BYTE_STEP) {
					ci.code = code + 1;
					ci.codeLen = codeLen - 1;
					ci.codeOffset = codeOffset + 1;
				}

				/* See if we need to filter this instruction. */
				if ((features & DF_RETURN_FC_ONLY) && (META_GET_FC(pdi->meta) == FC_NONE)) {
					continue;
				}

				/* Check whether we need to stop on any feature. */
				if ((features & DF_STOP_ON_PRIVILEGED) && (FLAG_GET_PRIVILEGED(pdi->flags))) {
					pdi = (_DInst*)((char*)pdi + diStructSize);
					break; /* ret = DECRES_SUCCESS; */
				}

				if (features & DF_STOP_ON_FLOW_CONTROL) {
					unsigned int mfc = META_GET_FC(pdi->meta);
					if (mfc && (((features & DF_STOP_ON_CALL) && (mfc == FC_CALL)) ||
						((features & DF_STOP_ON_RET) && (mfc == FC_RET)) ||
						((features & DF_STOP_ON_SYS) && (mfc == FC_SYS)) ||
						((features & DF_STOP_ON_UNC_BRANCH) && (mfc == FC_UNC_BRANCH)) ||
						((features & DF_STOP_ON_CND_BRANCH) && (mfc == FC_CND_BRANCH)) ||
						((features & DF_STOP_ON_INT) && (mfc == FC_INT)) ||
						((features & DF_STOP_ON_CMOV) && (mfc == FC_CMOV)) ||
						((features & DF_STOP_ON_HLT) && (mfc == FC_HLT)))) {
						pdi = (_DInst*)((char*)pdi + diStructSize);
						break; /* ret = DECRES_SUCCESS; */
					}
				}
			}

			/* Allocate at least one more entry to use, for the next instruction. */
			pdi = (_DInst*)((char*)pdi + diStructSize);
		}
		else { /* ret == DECRES_INPUTERR */

			/* Handle failure of decoding last instruction. */
			if ((!(features & DF_RETURN_FC_ONLY))) {
				memset(pdi, 0, sizeof(_DInst));
				pdi->flags = FLAG_NOT_DECODABLE;
				pdi->imm.byte = *code;
				pdi->size = 1;
				pdi->addr = codeOffset & ci.addrMask;
				pdi = (_DInst*)((char*)pdi + diStructSize);

				/* If an instruction wasn't decoded then stop on undecodeable if set. */
				if (features & DF_STOP_ON_UNDECODEABLE) {
					ret = DECRES_SUCCESS;
					break;
				}
			}

			/* Skip a single byte in case of a failure and retry instruction. */
			ci.code = code + 1;
			ci.codeLen = codeLen - 1;
			ci.codeOffset = codeOffset + 1;

			/* Reset return value. */
			ret = DECRES_SUCCESS;
		}
	}

	/* Set OUT params. */
	*usedInstructionsCount = (unsigned int)(((size_t)pdi - (size_t)result) / (size_t)diStructSize);
	_ci->nextOffset = ci.codeOffset;

	return ret;
}